

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::copy
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> *this,
          EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pTVar3;
  undefined8 uVar4;
  byte *pbVar5;
  size_t size;
  long lVar6;
  
  if (this->len == 0) {
    pbVar5 = (byte *)0x0;
  }
  else {
    size = this->len * 0x10;
    pbVar5 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
    if (*(byte **)(dst + 8) < pbVar5 + size) {
      pbVar5 = BumpAllocator::allocateSlow((BumpAllocator *)dst,size,8);
    }
    else {
      *(byte **)(*(long *)dst + 8) = pbVar5 + size;
    }
    sVar2 = this->len;
    if (sVar2 != 0) {
      pTVar3 = this->data_;
      lVar6 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pTVar3->type).ptr + lVar6);
        uVar4 = puVar1[1];
        *(undefined8 *)(pbVar5 + lVar6) = *puVar1;
        *(undefined8 *)(pbVar5 + lVar6 + 8) = uVar4;
        lVar6 = lVar6 + 0x10;
      } while (sVar2 << 4 != lVar6);
    }
    if (this->len != 0 && pbVar5 == (byte *)0x0) {
      std::terminate();
    }
  }
  return (int)pbVar5;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }